

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_node.cpp
# Opt level: O2

void dumpToList_prefix(Node *n,vector<rengine::Node_*,_std::allocator<rengine::Node_*>_> *list)

{
  Node *n_00;
  Node *local_20;
  Node *n_local;
  
  local_20 = n;
  std::vector<rengine::Node_*,_std::allocator<rengine::Node_*>_>::push_back(list,&local_20);
  for (n_00 = local_20->m_child; n_00 != (Node *)0x0; n_00 = rengine::Node::sibling(n_00)) {
    dumpToList_prefix(n_00,list);
  }
  return;
}

Assistant:

static void dumpToList_prefix(Node *n, std::vector<Node *> &list)
{
    list.push_back(n);
    Node *c = n->child();
    while (c) {
        dumpToList_prefix(c, list);
        c = c->sibling();
    }
}